

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O1

int __thiscall
cppcms::sessions::session_file_storage::remove(session_file_storage *this,char *__filename)

{
  int extraout_EAX;
  locked_file file;
  char *local_a8 [2];
  char local_98 [16];
  string local_88;
  locked_file local_68;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,*(long *)__filename,*(long *)(__filename + 8) + *(long *)__filename
            );
  locked_file::locked_file(&local_68,this,&local_88,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (-1 < local_68.fd_) {
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_68.name_._M_dataplus._M_p,
               local_68.name_._M_dataplus._M_p + local_68.name_._M_string_length);
    unlink(local_a8[0]);
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0]);
    }
  }
  locked_file::~locked_file(&local_68);
  return extraout_EAX;
}

Assistant:

void session_file_storage::remove(std::string const &sid)
{
	locked_file file(this,sid,false);
	if(file.fd() >= 0)
		::unlink(file.name().c_str());
}